

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

bool tinygltf::ParseMesh(Mesh *mesh,Model *model,string *err,json *o)

{
  primitive_iterator_t *parent_node;
  vector<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_> *pvVar1;
  json *err_00;
  string *model_00;
  bool bVar2;
  json *pjVar3;
  reference o_00;
  allocator local_249;
  string local_248;
  allocator local_221;
  string local_220;
  undefined1 local_200 [8];
  Primitive primitive;
  json_const_array_iterator i;
  json_const_array_iterator primEnd;
  json_const_iterator primObject;
  allocator local_49;
  string local_48;
  json *local_28;
  json *o_local;
  string *err_local;
  Model *model_local;
  Mesh *mesh_local;
  
  local_28 = o;
  o_local = (json *)err;
  err_local = (string *)model;
  model_local = (Model *)mesh;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"name",&local_49);
  parent_node = &primObject.m_it.primitive_iterator;
  std::__cxx11::string::string((string *)parent_node);
  ParseStringProperty(&mesh->name,err,o,&local_48,false,(string *)parent_node);
  std::__cxx11::string::~string((string *)&primObject.m_it.primitive_iterator);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>::clear
            ((vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_> *)
             &(model_local->animations).
              super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>._M_impl.
              super__Vector_impl_data._M_finish);
  nlohmann::detail::
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::iter_impl((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)&primEnd.m_it.primitive_iterator);
  bVar2 = anon_unknown_57::FindMember
                    (local_28,"primitives",(json_const_iterator *)&primEnd.m_it.primitive_iterator);
  if (bVar2) {
    pjVar3 = anon_unknown_57::GetValue((json_const_iterator *)&primEnd.m_it.primitive_iterator);
    bVar2 = anon_unknown_57::IsArray(pjVar3);
    if (bVar2) {
      pjVar3 = anon_unknown_57::GetValue((json_const_iterator *)&primEnd.m_it.primitive_iterator);
      anon_unknown_57::ArrayEnd((json_const_array_iterator *)&i.m_it.primitive_iterator,pjVar3);
      pjVar3 = anon_unknown_57::GetValue((json_const_iterator *)&primEnd.m_it.primitive_iterator);
      anon_unknown_57::ArrayBegin
                ((json_const_array_iterator *)&primitive.extras.boolean_value_,pjVar3);
      while (bVar2 = nlohmann::detail::
                     iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator!=((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)&primitive.extras.boolean_value_,
                                  (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)&i.m_it.primitive_iterator), bVar2) {
        Primitive::Primitive((Primitive *)local_200);
        model_00 = err_local;
        pjVar3 = o_local;
        o_00 = nlohmann::detail::
               iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&primitive.extras.boolean_value_);
        bVar2 = ParsePrimitive((Primitive *)local_200,(Model *)model_00,(string *)pjVar3,o_00);
        if (bVar2) {
          std::vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>::
          emplace_back<tinygltf::Primitive>
                    ((vector<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_> *)
                     &(model_local->animations).
                      super__Vector_base<tinygltf::Animation,_std::allocator<tinygltf::Animation>_>.
                      _M_impl.super__Vector_impl_data._M_finish,(Primitive *)local_200);
        }
        Primitive::~Primitive((Primitive *)local_200);
        nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)&primitive.extras.boolean_value_);
      }
    }
  }
  err_00 = o_local;
  pjVar3 = local_28;
  pvVar1 = &model_local->buffers;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,"weights",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_248,"",&local_249);
  ParseNumberArrayProperty
            ((vector<double,_std::allocator<double>_> *)
             &(pvVar1->super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>).
              _M_impl.super__Vector_impl_data._M_finish,(string *)err_00,pjVar3,&local_220,false,
             &local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  ParseExtensionsProperty
            ((ExtensionMap *)
             &(model_local->bufferViews).
              super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>.
              _M_impl.super__Vector_impl_data._M_finish,(string *)o_local,local_28);
  ParseExtrasProperty((Value *)&(model_local->meshes).
                                super__Vector_base<tinygltf::Mesh,_std::allocator<tinygltf::Mesh>_>.
                                _M_impl.super__Vector_impl_data._M_finish,local_28);
  return true;
}

Assistant:

static bool ParseMesh(Mesh *mesh, Model *model, std::string *err,
                      const json &o) {
  ParseStringProperty(&mesh->name, err, o, "name", false);

  mesh->primitives.clear();
  json_const_iterator primObject;
  if (FindMember(o, "primitives", primObject) &&
      IsArray(GetValue(primObject))) {
    json_const_array_iterator primEnd = ArrayEnd(GetValue(primObject));
    for (json_const_array_iterator i = ArrayBegin(GetValue(primObject));
         i != primEnd; ++i) {
      Primitive primitive;
      if (ParsePrimitive(&primitive, model, err, *i)) {
        // Only add the primitive if the parsing succeeds.
        mesh->primitives.emplace_back(std::move(primitive));
      }
    }
  }

  // Should probably check if has targets and if dimensions fit
  ParseNumberArrayProperty(&mesh->weights, err, o, "weights", false);

  ParseExtensionsProperty(&mesh->extensions, err, o);
  ParseExtrasProperty(&(mesh->extras), o);

  return true;
}